

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.h
# Opt level: O0

raw_ostream * __thiscall llvm::raw_ostream::operator<<(raw_ostream *this,StringRef Str)

{
  char *__buf;
  size_t Size;
  raw_ostream *this_local;
  StringRef Str_local;
  
  __buf = (char *)Str.Length;
  if (this->OutBufEnd + -(long)this->OutBufCur < __buf) {
    Str_local.Length =
         write(this,(int)Str.Data,__buf,(size_t)(this->OutBufEnd + -(long)this->OutBufCur));
  }
  else {
    Str_local.Length = (size_t)this;
    if (__buf != (char *)0x0) {
      memcpy(this->OutBufCur,Str.Data,(size_t)__buf);
      this->OutBufCur = __buf + (long)this->OutBufCur;
    }
  }
  return (raw_ostream *)Str_local.Length;
}

Assistant:

raw_ostream &operator<<(StringRef Str) {
    // Inline fast path, particularly for strings with a known length.
    size_t Size = Str.size();

    // Make sure we can use the fast path.
    if (Size > (size_t)(OutBufEnd - OutBufCur))
      return write(Str.data(), Size);

    if (Size) {
      memcpy(OutBufCur, Str.data(), Size);
      OutBufCur += Size;
    }
    return *this;
  }